

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

DescriptorNode *
cfd::core::DescriptorNode::Parse
          (DescriptorNode *__return_storage_ptr__,string *output_descriptor,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  uint uVar1;
  uint32_t uVar2;
  DescriptorScriptReference local_3f8;
  allocator local_a1;
  value_type local_a0;
  uint local_7c;
  undefined1 local_78 [4];
  uint32_t index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string local_58;
  byte local_21;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_20;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  string *output_descriptor_local;
  DescriptorNode *node;
  
  local_21 = 0;
  local_20 = network_parameters;
  network_parameters_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
       output_descriptor;
  output_descriptor_local = &__return_storage_ptr__->name_;
  DescriptorNode(__return_storage_ptr__,network_parameters);
  __return_storage_ptr__->node_type_ = kDescriptorTypeScript;
  AnalyzeChild(__return_storage_ptr__,(string *)network_parameters_local,0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_58,"",
             (allocator *)
             ((long)&list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  AnalyzeAll(__return_storage_ptr__,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  local_7c = 0;
  while( true ) {
    uVar1 = local_7c;
    uVar2 = GetNeedArgumentNum(__return_storage_ptr__);
    if (uVar2 <= uVar1) break;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a0,"0",&local_a1);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78,&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    local_7c = local_7c + 1;
  }
  GetReference(&local_3f8,__return_storage_ptr__,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,(DescriptorNode *)0x0);
  DescriptorScriptReference::~DescriptorScriptReference(&local_3f8);
  local_21 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  if ((local_21 & 1) == 0) {
    ~DescriptorNode(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

DescriptorNode DescriptorNode::Parse(
    const std::string& output_descriptor,
    const std::vector<AddressFormatData>& network_parameters) {
  DescriptorNode node(network_parameters);
  node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
  node.AnalyzeChild(output_descriptor, 0);
  node.AnalyzeAll("");
  // Script generate test
  std::vector<std::string> list;
  for (uint32_t index = 0; index < node.GetNeedArgumentNum(); ++index) {
    list.push_back("0");
  }
  node.GetReference(&list);
  return node;
}